

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitterHandle::mouseMoveEvent(QSplitterHandle *this,QMouseEvent *e)

{
  long lVar1;
  QWidget *this_00;
  QSplitter *this_01;
  Representation RVar2;
  bool bVar3;
  QPoint QVar4;
  int iVar5;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(byte *)(lVar1 + 0x268) & 4) != 0) {
    this_00 = *(QWidget **)(lVar1 + 0x10);
    local_38 = QSinglePointEvent::globalPosition((QSinglePointEvent *)e);
    local_28 = QPointF::toPoint(&local_38);
    QVar4 = QWidget::mapFromGlobal(this_00,&local_28);
    RVar2 = QVar4.yp.m_i;
    if (*(int *)(lVar1 + 0x260) == 1) {
      RVar2 = QVar4.xp.m_i;
    }
    iVar5 = RVar2.m_i - *(int *)(lVar1 + 0x264);
    bVar3 = opaqueResize(this);
    if (bVar3) {
      moveSplitter(this,iVar5);
    }
    else {
      this_01 = *(QSplitter **)(lVar1 + 600);
      iVar5 = closestLegalPosition(this,iVar5);
      QSplitter::setRubberBand(this_01,iVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSplitterHandle::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QSplitterHandle);
    if (!d->pressed)
        return;

    const int pos = d->pick(parentWidget()->mapFromGlobal(e->globalPosition().toPoint()))
                    - d->mouseOffset;
    if (opaqueResize()) {
        moveSplitter(pos);
    } else {
        d->s->setRubberBand(closestLegalPosition(pos));
    }
}